

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O1

int BN_sub(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  pBVar4 = b;
  if (a->neg == 0) {
    bVar7 = b->neg == 0;
    uVar5 = 0;
  }
  else {
    bVar6 = b->neg == 0;
    bVar7 = !bVar6;
    if (!bVar6) {
      pBVar4 = a;
    }
    uVar5 = (uint)bVar6;
    if (!bVar6) {
      a = b;
    }
  }
  if (bVar7) {
    iVar1 = pBVar4->top;
    if (pBVar4->top < a->top) {
      iVar1 = a->top;
    }
    pBVar3 = bn_wexpand((BIGNUM *)r,iVar1);
    if (pBVar3 == (BIGNUM *)0x0) {
      return 0;
    }
    iVar1 = BN_ucmp(a,pBVar4);
    if (iVar1 < 0) {
      iVar2 = BN_usub(r,pBVar4,a);
    }
    else {
      iVar2 = BN_usub(r,a,pBVar4);
    }
    uVar5 = (uint)(iVar1 < 0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = BN_uadd(r,a,pBVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  r->neg = uVar5;
  return 1;
}

Assistant:

int BN_sub(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max;
    int add = 0, neg = 0;

    bn_check_top(a);
    bn_check_top(b);

    /*-
     *  a -  b      a-b
     *  a - -b      a+b
     * -a -  b      -(a+b)
     * -a - -b      b-a
     */
    if (a->neg) {
        if (b->neg) {
            const BIGNUM *tmp;

            tmp = a;
            a = b;
            b = tmp;
        } else {
            add = 1;
            neg = 1;
        }
    } else {
        if (b->neg) {
            add = 1;
            neg = 0;
        }
    }

    if (add) {
        if (!BN_uadd(r, a, b))
            return 0;
        r->neg = neg;
        return 1;
    }

    /* We are actually doing a - b :-) */

    max = (a->top > b->top) ? a->top : b->top;
    if (bn_wexpand(r, max) == NULL)
        return 0;
    if (BN_ucmp(a, b) < 0) {
        if (!BN_usub(r, b, a))
            return 0;
        r->neg = 1;
    } else {
        if (!BN_usub(r, a, b))
            return 0;
        r->neg = 0;
    }
    bn_check_top(r);
    return 1;
}